

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O3

void __thiscall
slang::parsing::Preprocessor::applyResetPragma(Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  int iVar1;
  SyntaxNode *this_00;
  SimplePragmaExpressionSyntax *pSVar2;
  size_t __n;
  Diagnostic *this_01;
  int *__s1;
  char *__s2;
  size_type __rlen;
  ulong uVar3;
  size_t index;
  string_view arg;
  SourceRange SVar4;
  
  uVar3 = (pragma->args).elements.size_ + 1;
  if (1 < uVar3) {
    index = 0;
    do {
      this_00 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                 operator[](&pragma->args,index)->super_SyntaxNode;
      if ((this_00->kind == SimplePragmaExpression) &&
         (pSVar2 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>
                             (this_00), (pSVar2->value).kind == Identifier)) {
        arg = Token::rawText(&pSVar2->value);
        __s1 = (int *)arg._M_str;
        __n = arg._M_len;
        if ((long)__n < 7) {
          if (__n != 0) {
            if (__n == 4) {
              __s2 = "once";
              goto LAB_001a0e44;
            }
LAB_001a0e50:
            SVar4 = Token::range(&pSVar2->value);
            this_01 = addDiag(this,(DiagCode)0x2b0004,SVar4);
            Diagnostic::operator<<(this_01,arg);
            if (__n == 7) goto LAB_001a0e81;
          }
        }
        else if (__n == 10) {
          __s2 = "diagnostic";
LAB_001a0e44:
          iVar1 = bcmp(__s1,__s2,__n);
          if (iVar1 != 0) goto LAB_001a0e50;
        }
        else {
          if ((__n != 7) || (*(int *)((long)__s1 + 3) != 0x74636574 || *__s1 != 0x746f7270))
          goto LAB_001a0e50;
LAB_001a0e81:
          if (*(int *)((long)__s1 + 3) == 0x74636574 && *__s1 == 0x746f7270) {
            this->protectEncryptDepth = 0;
            this->protectDecryptDepth = 0;
            this->protectLineLength = 0;
            this->protectBytes = 0;
            this->protectEncoding = Raw;
          }
        }
      }
      else {
        SVar4 = slang::syntax::SyntaxNode::sourceRange(this_00);
        addDiag(this,(DiagCode)0x90004,SVar4);
      }
      index = index + 1;
    } while (uVar3 >> 1 != index);
  }
  return;
}

Assistant:

void Preprocessor::applyResetPragma(const PragmaDirectiveSyntax& pragma) {
    // Just check that we know about the names being reset, and warn if we don't.
    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            if (simple.value.kind == TokenKind::Identifier) {
                string_view name = simple.value.rawText();
                if (!name.empty() && name != "protect" && name != "once" && name != "diagnostic")
                    addDiag(diag::UnknownPragma, simple.value.range()) << name;

                if (name == "protect")
                    resetProtectState();

                continue;
            }
        }

        // Otherwise this isn't even a pragma name, so it's ill-formed.
        addDiag(diag::ExpectedPragmaName, arg->sourceRange());
    }
}